

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::OnIndexedFuncRef(TypeChecker *this,Index *out_index)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Type in_RAX;
  Type type;
  Type local_28;
  
  local_28 = in_RAX;
  RVar1 = PeekType(this,0,&local_28);
  if (local_28.enum_ != Reference) {
    local_28.enum_ = Reference;
    local_28.type_index_ = 0xffffffff;
  }
  RVar2 = PopAndCheck1Type(this,local_28,"call_ref");
  if (RVar2.enum_ != Error && RVar1.enum_ != Error) {
    if (local_28.enum_ != Reference) {
      __assert_fail("enum_ == Enum::Reference",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/type.h"
                    ,0x9c,"Index wabt::Type::GetReferenceIndex() const");
    }
    *out_index = local_28.type_index_;
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::OnIndexedFuncRef(Index* out_index) {
  Type type;
  Result result = PeekType(0, &type);
  if (!type.IsReferenceWithIndex()) {
    type = Type(Type::Reference, kInvalidIndex);
  }
  result |= PopAndCheck1Type(type, "call_ref");
  if (Succeeded(result)) {
    *out_index = type.GetReferenceIndex();
  }
  return result;
}